

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CAdES.h
# Opt level: O0

size_t __thiscall SigningCertificateV2::SetDataSize(SigningCertificateV2 *this)

{
  size_t sVar1;
  size_t sVar2;
  SigningCertificateV2 *this_local;
  
  sVar1 = GetEncodedSize<ESSCertIDv2>(&this->certs);
  sVar2 = GetEncodedSize<PolicyInformation>(&this->policies);
  (this->super_DerBase).cbData = sVar1 + sVar2;
  return (this->super_DerBase).cbData;
}

Assistant:

virtual size_t SetDataSize() override
	{
		cbData = GetEncodedSize(certs) + GetEncodedSize(policies);
		return cbData;
	}